

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

void __thiscall CmdLineArgsParser::ParseFlag(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  ICustomConfigFlags *pIVar2;
  code *pcVar3;
  char cVar4;
  bool bVar5;
  Flag flag;
  Flag flag_00;
  FlagTypes FVar6;
  int iVar7;
  undefined8 *puVar8;
  String *this_00;
  undefined4 *puVar9;
  NumberTrioSet *numberTrioSet;
  NumberRange *pRange;
  Number *pNVar10;
  NumberSet *numberPairSet;
  NumberPairSet *numberPairSet_00;
  Phases *oppositePhase;
  Phases *pPhaseList;
  char16_t *pcVar11;
  ConfigFlagsTable **ppCVar12;
  WCHAR local_428 [4];
  char16 buffer [512];
  
  memset(local_428,0,0x400);
  ParseString(this,local_428,0x200,true);
  flag = Js::ConfigFlagsTable::GetFlag(local_428);
  if (flag == InvalidFlag) {
    pIVar2 = this->pCustomConfigFlags;
    if ((pIVar2 == (ICustomConfigFlags *)0x0) ||
       (cVar4 = (**(code **)(*(long *)pIVar2 + 8))(pIVar2,local_428,this), cVar4 == '\0')) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar11 = L"Invalid Flag";
LAB_003518d9:
      *puVar8 = pcVar11;
      __cxa_throw(puVar8,&Exception::typeinfo,0);
    }
  }
  else {
    FVar6 = Js::ConfigFlagsTable::GetFlagType(flag);
    if (FVar6 == InvalidFlagType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                         ,0x220,"(InvalidFlagType != flagType)","Invalid flag type");
      if (!bVar5) goto LAB_00351b56;
      *puVar9 = 0;
      Js::ConfigFlagsTable::Enable(this->flagTable,flag);
    }
    else {
      Js::ConfigFlagsTable::Enable(this->flagTable,flag);
      if (FVar6 == FlagBoolean) {
        bVar5 = ParseBoolean(this);
        Js::ConfigFlagsTable::SetAsBoolean(this->flagTable,flag,bVar5);
        return;
      }
    }
    ppCVar12 = &this->flagTable;
    WVar1 = *this->pszCurrentArg;
    if ((WVar1 != L'\0') && (WVar1 != L' ')) {
      if (WVar1 != L':') {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar11 = L"Expected \':\'";
        goto LAB_003518d9;
      }
      this->pszCurrentArg = this->pszCurrentArg + 1;
      switch(FVar6) {
      case FlagString:
        ParseString(this,local_428,0x200,false);
        this_00 = Js::ConfigFlagsTable::GetAsString(this->flagTable,flag);
        Js::String::Set(this_00,local_428);
        break;
      case FlagPhases:
        flag_00 = Js::ConfigFlagsTable::GetOppositePhaseFlag(*ppCVar12,flag);
        if (flag_00 == InvalidFlag) {
          oppositePhase = (Phases *)0x0;
        }
        else {
          Js::ConfigFlagsTable::Enable(*ppCVar12,flag_00);
          oppositePhase = Js::ConfigFlagsTable::GetAsPhase(*ppCVar12,flag_00);
        }
        pPhaseList = Js::ConfigFlagsTable::GetAsPhase(this->flagTable,flag);
        ParsePhase(this,pPhaseList,oppositePhase);
        break;
      case FlagNumber:
        iVar7 = ParseInteger(this);
        pNVar10 = Js::ConfigFlagsTable::GetAsNumber(this->flagTable,flag);
        *pNVar10 = iVar7;
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                           ,600,"(0)","Flag not Handled");
        if (!bVar5) {
LAB_00351b56:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        break;
      case FlagNumberSet:
        numberPairSet = Js::ConfigFlagsTable::GetAsNumberSet(this->flagTable,flag);
        ParseNumberSet(this,numberPairSet);
        break;
      case FlagNumberPairSet:
        numberPairSet_00 = Js::ConfigFlagsTable::GetAsNumberPairSet(this->flagTable,flag);
        ParseNumberPairSet(this,numberPairSet_00);
        break;
      case FlagNumberTrioSet:
        numberTrioSet = Js::ConfigFlagsTable::GetAsNumberTrioSet(this->flagTable,flag);
        ParseNumberTrioSet(this,numberTrioSet);
        break;
      case FlagNumberRange:
        pRange = Js::ConfigFlagsTable::GetAsNumberRange(this->flagTable,flag);
        ParseNumberRange(this,pRange);
      }
    }
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseFlag()
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    LPWSTR flagString = ParseString(buffer);
    Flag flag = ConfigFlagsTable::GetFlag(flagString);
    if(InvalidFlag == flag)
    {
        if (pCustomConfigFlags != nullptr)
        {
            if (pCustomConfigFlags->ParseFlag(flagString, this))
            {
                return;
            }
        }
        throw Exception(_u("Invalid Flag"));
    }


    FlagTypes flagType = ConfigFlagsTable::GetFlagType(flag);
    AssertMsg(InvalidFlagType != flagType, "Invalid flag type");

    this->flagTable.Enable(flag);

    if(FlagBoolean == flagType)
    {
        Boolean boolValue = ParseBoolean();

        this->flagTable.SetAsBoolean(flag, boolValue);
    }
    else
    {
        switch(CurChar())
        {
        case ':':
            NextChar();
            switch(flagType)
            {
            case FlagPhases:
            {
                Flag oppositeFlag = this->flagTable.GetOppositePhaseFlag(flag);
                Phases* oppositePhase = nullptr;
                if (oppositeFlag != InvalidFlag)
                {
                    this->flagTable.Enable(oppositeFlag);
                    oppositePhase = this->flagTable.GetAsPhase(oppositeFlag);
                }
                ParsePhase(this->flagTable.GetAsPhase(flag), oppositePhase);
                break;
            }

            case FlagString:
                *this->flagTable.GetAsString(flag) = ParseString(buffer, MaxTokenSize, false);
                break;

            case FlagNumber:
                *this->flagTable.GetAsNumber(flag) = ParseInteger();
                break;

            case FlagNumberSet:
                ParseNumberSet(this->flagTable.GetAsNumberSet(flag));
                break;

            case FlagNumberPairSet:
                ParseNumberPairSet(this->flagTable.GetAsNumberPairSet(flag));
                break;

            case FlagNumberTrioSet:
                ParseNumberTrioSet(this->flagTable.GetAsNumberTrioSet(flag));
                break;

            case FlagNumberRange:
                ParseNumberRange(this->flagTable.GetAsNumberRange(flag));
                break;

            default:
                AssertMsg(0, "Flag not Handled");
            }
            break;
        case ' ':
        case 0:
            break;
        default:
            throw Exception(_u("Expected ':'"));
        }
    }
}